

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Spatializer.cpp
# Opt level: O1

void Spatializer::GetHRTF(int channel,UnityComplexNumber *h,float azimuth,float elevation)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  
  fVar4 = elevation * 0.1 + 4.0;
  fVar4 = ((ABS(fVar4) - ABS(fVar4 + -12.0)) + 12.0) * 0.5;
  fVar3 = floorf(fVar4);
  uVar2 = 0xc;
  if ((int)fVar3 < 0xc) {
    uVar2 = (int)fVar3;
  }
  uVar1 = 0;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  uVar2 = 0xb;
  if ((int)uVar1 < 0xb) {
    uVar2 = uVar1;
  }
  HRTFData::CircleCoeffs::GetHRTF
            ((CircleCoeffs *)(sharedData + (ulong)uVar1 * 0x18 + (ulong)(uint)channel * 0x150),h,
             azimuth,1.0);
  HRTFData::CircleCoeffs::GetHRTF
            ((CircleCoeffs *)(sharedData + (ulong)(uVar2 + 1) * 0x18 + (ulong)(uint)channel * 0x150)
             ,h,azimuth,fVar4 - fVar3);
  return;
}

Assistant:

static void GetHRTF(int channel, UnityComplexNumber* h, float azimuth, float elevation)
    {
        float e = FastClip(elevation * 0.1f + 4, 0, 12);
        float f = floorf(e);
        int index1 = (int)f;
        if (index1 < 0)
            index1 = 0;
        else if (index1 > 12)
            index1 = 12;
        int index2 = index1 + 1;
        if (index2 > 12)
            index2 = 12;
        sharedData.hrtfChannel[channel][index1].GetHRTF(h, azimuth, 1.0f);
        sharedData.hrtfChannel[channel][index2].GetHRTF(h, azimuth, e - f);
    }